

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O0

void set_obj_color_proc(Am_Object *param_1,Am_Object *obj,Am_Value *new_value)

{
  bool bVar1;
  byte bVar2;
  byte local_71;
  Am_Object local_50;
  byte local_41;
  Am_Object local_40 [3];
  Am_Object local_28;
  Am_Value *local_20;
  Am_Value *new_value_local;
  Am_Object *obj_local;
  Am_Object *param_0_local;
  
  local_20 = new_value;
  new_value_local = (Am_Value *)obj;
  obj_local = param_1;
  Am_Object::Am_Object(&local_28,(Am_Object *)&Am_Line);
  local_41 = 0;
  bVar1 = false;
  bVar2 = Am_Object::Is_Instance_Of((Am_Object *)obj);
  local_71 = 1;
  if ((bVar2 & 1) == 0) {
    Am_Object::Am_Object(local_40,(Am_Object *)&freehand_line_proto);
    local_41 = 1;
    bVar2 = Am_Object::Is_Instance_Of((Am_Object *)obj);
    local_71 = 1;
    if ((bVar2 & 1) == 0) {
      Am_Object::Am_Object(&local_50,(Am_Object *)&Am_Text);
      bVar1 = true;
      local_71 = Am_Object::Is_Instance_Of((Am_Object *)obj);
    }
  }
  if (bVar1) {
    Am_Object::~Am_Object(&local_50);
  }
  if ((local_41 & 1) != 0) {
    Am_Object::~Am_Object(local_40);
  }
  Am_Object::~Am_Object(&local_28);
  if ((local_71 & 1) == 0) {
    Am_Object::Set((ushort)obj,(Am_Value *)0x6a,(ulong)new_value);
  }
  else {
    Am_Object::Set((ushort)obj,(Am_Value *)0x6b,(ulong)new_value);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Set_Object_Property_Value_Method, void, set_obj_color,
                 (Am_Object /* command_obj */, Am_Object obj,
                  Am_Value new_value))
{
  if (obj.Is_Instance_Of(Am_Line) || obj.Is_Instance_Of(freehand_line_proto) ||
      obj.Is_Instance_Of(Am_Text))
    obj.Set(Am_LINE_STYLE, new_value);
  else
    obj.Set(Am_FILL_STYLE, new_value);
}